

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  pointer *__lhs;
  bool bVar1;
  reference prVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [32];
  value_type local_170;
  undefined1 local_110 [8];
  result x;
  iterator __end1;
  iterator __begin1;
  vector<Lexer::result,_std::allocator<Lexer::result>_> *__range1;
  vector<Parser::result,_std::allocator<Parser::result>_> newLexRes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [36];
  int local_c;
  
  local_c = 0;
  std::operator+(local_30,prefix_abi_cxx11_);
  Lexer::goLex(local_30);
  std::__cxx11::string::~string((string *)local_30);
  __lhs = &newLexRes.super__Vector_base<Parser::result,_std::allocator<Parser::result>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 prefix_abi_cxx11_);
  std::operator+(local_60,(char *)__lhs);
  Lexer::print(local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string
            ((string *)
             &newLexRes.super__Vector_base<Parser::result,_std::allocator<Parser::result>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)Parser::lineRec,
             (vector<int,_std::allocator<int>_> *)Lexer::lineRec);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)Parser::endTran_abi_cxx11_,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)Lexer::endTran_abi_cxx11_);
  std::vector<Parser::result,_std::allocator<Parser::result>_>::vector
            ((vector<Parser::result,_std::allocator<Parser::result>_> *)&__range1);
  __end1 = std::vector<Lexer::result,_std::allocator<Lexer::result>_>::begin
                     ((vector<Lexer::result,_std::allocator<Lexer::result>_> *)Lexer::LexRes);
  x._88_8_ = std::vector<Lexer::result,_std::allocator<Lexer::result>_>::end
                       ((vector<Lexer::result,_std::allocator<Lexer::result>_> *)Lexer::LexRes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Lexer::result_*,_std::vector<Lexer::result,_std::allocator<Lexer::result>_>_>
                                *)&x.field_0x58);
    if (!bVar1) break;
    prVar2 = __gnu_cxx::
             __normal_iterator<Lexer::result_*,_std::vector<Lexer::result,_std::allocator<Lexer::result>_>_>
             ::operator*(&__end1);
    Lexer::result::result((result *)local_110,prVar2);
    std::__cxx11::string::string((string *)&local_170,(string *)local_110);
    std::__cxx11::string::string((string *)&local_170.name,(string *)&x.field_0x18);
    std::__cxx11::string::string((string *)&local_170.value,(string *)&x.field_0x38);
    std::vector<Parser::result,_std::allocator<Parser::result>_>::push_back
              ((vector<Parser::result,_std::allocator<Parser::result>_> *)&__range1,&local_170);
    Parser::result::~result(&local_170);
    Lexer::result::~result((result *)local_110);
    __gnu_cxx::
    __normal_iterator<Lexer::result_*,_std::vector<Lexer::result,_std::allocator<Lexer::result>_>_>
    ::operator++(&__end1);
  }
  std::operator+(local_190,prefix_abi_cxx11_);
  Parser::init((EVP_PKEY_CTX *)local_190);
  std::__cxx11::string::~string((string *)local_190);
  Parser::goParser((vector<Parser::result,_std::allocator<Parser::result>_> *)&__range1);
  std::operator+(local_1d0,prefix_abi_cxx11_);
  std::operator+(local_1b0,(char *)local_1d0);
  Parser::printFile(local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1d0);
  std::operator+(local_210,prefix_abi_cxx11_);
  std::operator+(local_1f0,(char *)local_210);
  Parser::printVariable(local_1f0);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_210);
  std::operator+(local_250,prefix_abi_cxx11_);
  std::operator+(local_230,(char *)local_250);
  Parser::printLine(local_230);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::~string((string *)local_250);
  local_c = 0;
  std::vector<Parser::result,_std::allocator<Parser::result>_>::~vector
            ((vector<Parser::result,_std::allocator<Parser::result>_> *)&__range1);
  return local_c;
}

Assistant:

int main(){
	//freopen(prefix + "tmp.txt","w",stdout);
	Lexer::goLex(prefix+"test.txt");
	Lexer::print(prefix+"result/"+"lexer.txt");
	Parser::lineRec = Lexer::lineRec;
	Parser::endTran = Lexer::endTran;
	vector<Parser::result> newLexRes;
	for(auto x : Lexer::LexRes){
		newLexRes.push_back((Parser::result){x.type , x.name , x.value});
	} 
	Parser::init(prefix+"generator.txt");
	Parser::goParser(newLexRes);

	Parser::printFile(prefix+"result/"+"parser.txt");

	Parser::printVariable(prefix+"result/"+"Variable.txt");
	Parser::printLine(prefix+"result/"+"Line.txt");
	return 0;
}